

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wabtapi.cc
# Opt level: O2

void write_action(Context *ctx,Var obj,ActionPtr *action)

{
  Var value;
  InvokeAction *pIVar1;
  Action *base;
  
  value = (*ctx->chakra->spec->createObject)(ctx->chakra->user_data);
  set_property(ctx,obj,1,value,"Unable to set action");
  base = (action->_M_t).super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t
         .super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
         super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl;
  if ((base->module_var).type_ == Name) {
    write_var(ctx,value,9,&base->module_var);
    base = (action->_M_t).super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>.
           _M_t.super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
           super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl;
  }
  if (base->type_ != Get) {
    if (base->type_ == Invoke) {
      pIVar1 = wabt::cast<wabt::InvokeAction,wabt::Action>(base);
      write_string(ctx,value,0xb,"invoke",0xffffffff);
      write_string(ctx,value,6,&(pIVar1->super_ActionMixin<(wabt::ActionType)0>).super_Action.name);
      write_const_vector(ctx,value,2,&pIVar1->args);
      return;
    }
    __assert_fail("action->type() == ActionType::Get",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/chakra/wabtapi.cc"
                  ,0x113,"void write_action(Context *, Js::Var, const ActionPtr &)");
  }
  write_string(ctx,value,0xb,"get",0xffffffff);
  write_string(ctx,value,6,
               &((action->_M_t).
                 super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t.
                 super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
                 super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl)->name);
  return;
}

Assistant:

void write_action(Context* ctx, Js::Var obj, const ActionPtr& action)
{
    Js::Var actionObj = ctx->chakra->spec->createObject(ctx->chakra->user_data);
    set_property(ctx, obj, PropertyIds::action, actionObj, "Unable to set action");

    if (action->module_var.is_name())
    {
        write_var(ctx, actionObj, PropertyIds::module, &action->module_var);
    }
    if (action->type() == ActionType::Invoke)
    {
        const InvokeAction* iaction = cast<InvokeAction>(action.get());
        write_string(ctx, actionObj, PropertyIds::type, "invoke");
        write_string(ctx, actionObj, PropertyIds::field, iaction->name);
        write_const_vector(ctx, actionObj, PropertyIds::args, iaction->args);
    }
    else
    {
        assert(action->type() == ActionType::Get);
        write_string(ctx, actionObj, PropertyIds::type, "get");
        write_string(ctx, actionObj, PropertyIds::field, action->name);
    }
}